

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

FFSVarRec_conflict LookupVarByName(SstStream Stream,char *Name)

{
  int iVar1;
  SMPI_Comm pSVar2;
  FFSVarRec_conflict pFVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = *(int *)&Stream->CPInfo;
  if (0 < (long)iVar1) {
    pSVar2 = Stream->mpiComm;
    lVar5 = 0;
    do {
      pFVar3 = *(FFSVarRec_conflict *)(pSVar2 + lVar5 * 8);
      iVar4 = strcmp(pFVar3->VarName,Name);
      if (iVar4 == 0) {
        return pFVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return (FFSVarRec_conflict)0x0;
}

Assistant:

static FFSVarRec LookupVarByName(SstStream Stream, const char *Name)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Info->VarCount; i++)
    {
        if (strcmp(Info->VarList[i]->VarName, Name) == 0)
        {
            return Info->VarList[i];
        }
    }

    return NULL;
}